

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeparser.cpp
# Opt level: O2

StateNode * __thiscall
QDateTimeParser::scanString
          (StateNode *__return_storage_ptr__,QDateTimeParser *this,QDateTime *defaultValue,
          bool fixup)

{
  QString *pQVar1;
  ulong uVar2;
  QStringView name;
  QDate date_00;
  QCalendar *this_00;
  int m;
  QTimeZone QVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  FieldInfo FVar7;
  Section SVar8;
  int iVar9;
  int iVar10;
  time_t tVar11;
  long lVar12;
  storage_type_conflict *psVar13;
  Data DVar14;
  QTime *pQVar15;
  QDate QVar16;
  ushort *puVar17;
  SectionNode *pSVar18;
  time_t *__timer;
  uint uVar19;
  undefined7 in_register_00000009;
  long lVar20;
  bool bVar21;
  QTime QVar22;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  int iVar23;
  storage_type_conflict *psVar24;
  uint uVar25;
  QDateTimeParser *__timer_00;
  QDate date_01;
  QDateTime *pQVar26;
  ulong uVar27;
  State SVar28;
  long in_FS_OFFSET;
  QLatin1StringView s;
  SectionNode sn;
  SectionNode sn_00;
  QStringView separator;
  QStringView separator_00;
  ParsedSection PVar29;
  QStringView text;
  QStringView text_00;
  State local_164;
  int hour;
  QDateTime *local_158;
  QCalendar *local_150;
  int local_148;
  int dayofweek;
  StateNode *local_140;
  int ampm;
  QDateTimeParser *local_130;
  ulong local_128;
  int local_120;
  int msec;
  int second;
  int minute;
  QTime local_110;
  int year2digits;
  ulong local_108;
  ulong local_100;
  QString *local_f8;
  ulong local_f0;
  undefined4 local_e4;
  long local_e0;
  long local_d8;
  QDate local_d0;
  QDate local_c8;
  QDateTime when;
  QDate date;
  QTimeZone namedZone;
  QDateTime usedDateTime;
  QTime time;
  QTimeZone timeZone;
  QTime local_54;
  QDate local_50;
  int day;
  int month;
  int year;
  long local_38;
  
  local_e4 = (undefined4)CONCAT71(in_register_00000009,fixup);
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_108 = (ulong)(uint)(this->sectionNodes).d.size;
  year = -0x55555556;
  month = -0x55555556;
  day = -0x55555556;
  __timer_00 = this;
  local_158 = defaultValue;
  local_140 = __return_storage_ptr__;
  local_50 = QDateTime::date(defaultValue);
  tVar11 = QDateTime::time(defaultValue,(time_t *)__timer_00);
  local_54.mds = (int)tVar11;
  QDate::getDate(&local_50,&year,&month,&day);
  year2digits = year % 100;
  hour = QTime::hour(&local_54);
  local_110.mds = 0xffffffff;
  minute = QTime::minute(&local_54);
  second = QTime::second(&local_54);
  msec = QTime::msec(&local_54);
  local_150 = &this->calendar;
  dayofweek = QCalendar::dayOfWeek(local_150,local_50);
  timeZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
  QDateTime::timeRepresentation((QDateTime *)&timeZone);
  ampm = -1;
  local_f8 = &this->m_text;
  iVar23 = (int)local_108;
  local_108 = local_108 & 0xffffffff;
  if (iVar23 < 1) {
    local_108 = 0;
  }
  local_164 = Acceptable;
  lVar20 = 0x10;
  local_e0 = 8;
  local_158 = (QDateTime *)((ulong)local_158 & 0xffffffff00000000);
  iVar23 = 0;
  local_148 = 0;
  bVar21 = false;
  uVar27 = 0;
  local_130 = this;
  while (lVar12 = (long)iVar23, local_108 != uVar27) {
    text.m_data = (this->m_text).d.ptr + lVar12;
    pQVar1 = (this->separators).d.ptr;
    text.m_size = (this->m_text).d.size - lVar12;
    separator.m_data = *(storage_type_conflict **)((long)pQVar1 + lVar20 + -8);
    separator.m_size = *(qsizetype *)((long)&(pQVar1->d).d + lVar20);
    local_128 = uVar27;
    local_d8 = lVar20;
    iVar6 = matchesSeparator(text,separator);
    if (iVar6 == -1) goto LAB_003bf525;
    local_120 = iVar6 + iVar23;
    pSVar18 = (this->sectionNodes).d.ptr;
    *(int *)((long)pSVar18 + local_e0 + -4) = local_120;
    time.mds = -0x55555556;
    local_100 = (ulong)*(uint *)((long)pSVar18 + local_e0 + -8);
    local_f0 = (ulong)*(uint *)((long)&pSVar18->type + local_e0);
    usedDateTime.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
    local_d0 = actualDate(local_158._0_4_,(this->calendar).d_ptr,this->defaultCenturyStart,year,
                          year2digits,month,day,dayofweek);
    QVar22.mds = local_110.mds;
    m = minute;
    iVar10 = second;
    iVar9 = msec;
    iVar6 = ampm;
    iVar23 = hour;
    date.jd._0_4_ = -0x55555556;
    QTime::QTime((QTime *)&date,hour,minute,second,msec);
    uVar19 = (uint)local_158._0_4_;
    if (0xc < (uint)QVar22.mds) {
      uVar19 = (uint)local_158._0_4_ & 0xffffffef;
      QVar22.mds = iVar23 % 0xc;
    }
    uVar25 = iVar23;
    if ((iVar6 == -1) || ((uVar19 & 1) == 0)) {
      if (((uVar19 & 0x10) != 0) && (iVar23 % 0xc != QVar22.mds)) {
        if (((uVar19 & 0x20) == 0) && (uVar25 = QVar22.mds + 0xc, iVar23 < 0xd)) {
          uVar25 = QVar22.mds;
        }
        goto LAB_003befc0;
      }
    }
    else {
      iVar6 = iVar6 * 0xc;
      if (iVar23 - QVar22.mds != iVar6) {
        if (((uVar19 & 0x20) == 0) && (uVar25 = QVar22.mds + iVar6, (uVar19 & 0x10) == 0)) {
          uVar25 = iVar23;
        }
LAB_003befc0:
        QTime::QTime((QTime *)&when,uVar25,m,iVar10,iVar9);
        date.jd._0_4_ = when.d._0_4_;
      }
    }
    QDateTime::QDateTime(&usedDateTime,local_d0,date.jd._0_4_,&timeZone,LegacyBehavior);
    iVar23 = local_120;
    this = local_130;
    PVar29 = parseSection(local_130,&usedDateTime,(int)local_128,local_120);
    uVar27 = PVar29._0_8_;
    SVar28 = PVar29.state;
    if (((((char)local_e4 != '\0') && (SVar28 == Intermediate)) && (PVar29.used < (int)local_f0)) &&
       (FVar7 = fieldInfo(this,(int)local_128),
       (~(uint)FVar7.super_QFlagsStorageHelper<QDateTimeParser::FieldInfoFlag,_4>.
               super_QFlagsStorage<QDateTimeParser::FieldInfoFlag>.i & 3) == 0)) {
      date.jd._0_4_ = -0x55555556;
      date.jd._4_4_ = 0xaaaaaaaa;
      QString::asprintf((char **)&date,"%0*d",local_f0,uVar27 & 0xffffffff);
      QString::replace(local_f8,(long)iVar23,(long)uVar27 >> 0x20,(QString *)&date);
      uVar27 = uVar27 & 0xffffffff | local_f0 << 0x20;
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&date);
    }
    if ((int)SVar28 <= (int)local_164) {
      local_164 = SVar28;
    }
    if ((local_164 == Invalid) ||
       ((this->context == FromString && ((local_164 == Intermediate || (PVar29.zeroes != 0)))))) {
LAB_003bf663:
      StateNode::StateNode(local_140);
      pQVar26 = &usedDateTime;
      goto LAB_003bf675;
    }
    SVar8 = (Section)local_100;
    switch(SVar8) {
    case AmPmSection:
      pQVar15 = (QTime *)&ampm;
      break;
    case MSecSection:
      pQVar15 = (QTime *)&msec;
      break;
    case MSecSection|AmPmSection:
    case SecondSection|AmPmSection:
    case SecondSection|MSecSection:
    case SecondSection|MSecSection|AmPmSection:
switchD_003bf20f_caseD_3:
      date.jd._0_4_ = 2;
      date.jd._4_4_ = 0;
      SectionNode::name((QString *)&when,SVar8);
      puVar17 = QString::utf16((QString *)&when);
      QMessageLogger::warning
                ((QMessageLogger *)&date,"QDateTimeParser::parse Internal error (%ls)",puVar17);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&when);
      goto LAB_003bf663;
    case SecondSection:
      pQVar15 = (QTime *)&second;
      break;
    case MinuteSection:
      pQVar15 = (QTime *)&minute;
      break;
    default:
      if (SVar8 == Hour12Section) {
        pQVar15 = &local_110;
      }
      else if (SVar8 == Hour24Section) {
        pQVar15 = (QTime *)&hour;
      }
      else if (SVar8 == DayOfWeekSectionLong) {
LAB_003bf21c:
        pQVar15 = (QTime *)&dayofweek;
      }
      else {
        iVar6 = (int)uVar27;
        if (SVar8 == DaySection) {
          uVar2 = 1;
          if (1 < iVar6) {
            uVar2 = uVar27;
          }
          uVar27 = uVar27 & 0xffffffff00000000 | uVar2 & 0xffffffff;
          pQVar15 = (QTime *)&day;
        }
        else if (SVar8 == MonthSection) {
          pQVar15 = (QTime *)&month;
        }
        else if (SVar8 == YearSection) {
          pQVar15 = (QTime *)&year;
        }
        else if (SVar8 == YearSection2Digits) {
          pQVar15 = (QTime *)&year2digits;
        }
        else {
          if (SVar8 == DayOfWeekSectionShort) goto LAB_003bf21c;
          if (SVar8 != TimeZoneSection) goto switchD_003bf20f_caseD_3;
          iVar9 = (int)(uVar27 >> 0x20);
          if (iVar9 < 1) {
            pQVar15 = &time;
            this = local_130;
            break;
          }
          psVar24 = (local_130->m_text).d.ptr + iVar23;
          when.d._4_4_ = 0;
          s.m_data = "UTC";
          s.m_size = 3;
          when.d._0_4_ = iVar9;
          bVar4 = QStringView::startsWith((QStringView *)&when,s,CaseSensitive);
          if (bVar4) {
            lVar20 = CONCAT44(when.d._4_4_,when.d._0_4_) + -3;
            psVar13 = psVar24 + 3;
          }
          else {
            lVar20 = CONCAT44(when.d._4_4_,when.d._0_4_);
            psVar13 = psVar24;
          }
          if (lVar20 == 0) {
            bVar4 = false;
          }
          else {
            bVar4 = (*psVar13 + L'ￕ' & 0xfffdU) == 0;
          }
          date.jd._0_4_ = 1;
          date.jd._4_4_ = 0;
          bVar5 = ::comparesEqual((QLatin1StringView *)&date,(QStringView *)&when);
          if (bVar5) {
LAB_003bf346:
            DVar14.d = (QTimeZonePrivate *)((3 - (ulong)(iVar6 == 0)) + (long)iVar6 * 4);
            if (0x1c200 < (long)iVar6 + 0xe100U) {
              DVar14.d = (QTimeZonePrivate *)0x0;
            }
            date.jd._0_4_ = timeZone.d._0_4_;
            date.jd._4_4_ = timeZone.d._4_4_;
            timeZone.d = DVar14;
LAB_003bf38e:
            QTimeZone::~QTimeZone((QTimeZone *)&date);
            this = local_130;
          }
          else {
            namedZone.d = (Data)(ShortData)0x3;
            bVar5 = ::comparesEqual((QLatin1StringView *)&namedZone,(QStringView *)&when);
            if (bVar4 || bVar5) goto LAB_003bf346;
            name.m_size._4_4_ = when.d._4_4_;
            name.m_size._0_4_ = when.d._0_4_;
            name.m_data = psVar24;
            (*local_130->_vptr_QDateTimeParser[6])((QArrayDataPointer<char> *)&date);
            iVar23 = startsWithLocalTimeZone(name,&usedDateTime,(QLocale *)&date);
            QLocale::~QLocale((QLocale *)&date);
            QVar3 = timeZone;
            if (iVar23 == iVar9) {
              timeZone.d = (Data)(ShortData)0x1;
              date.jd._0_4_ = QVar3.d._0_4_;
              date.jd._4_4_ = QVar3.d._4_4_;
              goto LAB_003bf38e;
            }
            namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
            QStringView::toLatin1((QByteArray *)&date,(QStringView *)&when);
            this = local_130;
            QTimeZone::QTimeZone(&namedZone,(QByteArray *)&date);
            QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&date);
            QTimeZone::operator=(&timeZone,&namedZone);
            QTimeZone::~QTimeZone(&namedZone);
          }
          pQVar15 = &time;
        }
      }
    }
    iVar23 = (int)(uVar27 >> 0x20);
    if (iVar23 == 0 || (long)uVar27 < 0) {
      iVar23 = 0;
    }
    if (((((uint)local_158._0_4_ & (uint)local_100) == 0) || (pQVar15->mds == (int)uVar27)) ||
       (bVar21 = true, local_128 == (uint)this->currentSectionIndex)) {
      pQVar15->mds = (int)uVar27;
      local_158 = (QDateTime *)CONCAT44(local_158._4_4_,(uint)local_100 | (uint)local_158._0_4_);
    }
    local_148 = local_148 + PVar29.zeroes;
    iVar23 = iVar23 + local_120;
    QDateTime::~QDateTime(&usedDateTime);
    lVar20 = local_d8 + 0x18;
    local_e0 = local_e0 + 0x10;
    uVar27 = local_128 + 1;
  }
  text_00.m_data = (this->m_text).d.ptr + lVar12;
  pQVar1 = (this->separators).d.ptr;
  text_00.m_size = (this->m_text).d.size - lVar12;
  lVar20 = (this->separators).d.size;
  separator_00.m_data = pQVar1[lVar20 + -1].d.ptr;
  separator_00.m_size = pQVar1[lVar20 + -1].d.size;
  iVar6 = matchesSeparator(text_00,separator_00);
  if ((iVar6 == -1) || ((long)(iVar6 + iVar23) < (this->m_text).d.size)) {
LAB_003bf525:
    StateNode::StateNode(local_140);
    goto LAB_003bf67a;
  }
  if (this->parserType == QTime) {
LAB_003bfa5f:
    iVar23 = hour;
    bVar4 = bVar21;
    if (((ulong)local_158 & 0x10) == 0) {
      if (ampm != -1) {
        if (((ulong)local_158 & 0x20) == 0) {
          iVar23 = ampm * 0xc;
        }
        else {
          bVar4 = true;
          if (0xb < hour != (ampm == 0)) {
            bVar4 = bVar21;
          }
        }
      }
    }
    else {
      uVar25 = (uint)local_158._0_4_ >> 5 & 1;
      uVar19 = (uint)(0xb < hour & (byte)uVar25);
      if (ampm != -1) {
        uVar19 = ampm;
      }
      iVar6 = uVar19 * 0xc + local_110.mds % 0xc;
      iVar23 = iVar6;
      if ((uVar25 != 0) && (iVar23 = hour, bVar4 = true, hour == iVar6)) {
        bVar4 = bVar21;
      }
    }
  }
  else {
    if ((year % 100 != year2digits) && (((ulong)local_158 & 0x800) != 0)) {
      date.jd._0_4_ = 0xaaaaaaaa;
      date.jd._4_4_ = 0xaaaaaaaa;
      QVar16 = actualDate(local_158._0_4_,(this->calendar).d_ptr,this->defaultCenturyStart,year,
                          year2digits,month,day,dayofweek);
      date.jd._0_4_ = (int)QVar16.jd;
      date.jd._4_4_ = (undefined4)((ulong)QVar16.jd >> 0x20);
      if (QVar16.jd + 0xb69eeff91fU < 0x16d3e147974) {
        if (((uint)local_158._0_4_ >> 10 & 1) == 0) {
          year = QDate::year(&date);
        }
        else {
          pSVar18 = sectionNode(this,this->currentSectionIndex);
          bVar21 = true;
          if (pSVar18->type == YearSection2Digits) {
            year = QDate::year(&date);
          }
        }
      }
      else {
        local_164 = Invalid;
      }
    }
    SVar8 = sectionType(this,this->currentSectionIndex);
    when.d._0_4_ = 0xaaaaaaaa;
    when.d._4_4_ = 0xaaaaaaaa;
    QDate::QDate((QDate *)&when,year,month,day,local_150->d_ptr);
    iVar23 = dayofweek;
    QVar16.jd._4_4_ = when.d._4_4_;
    QVar16.jd._0_4_ = when.d._0_4_;
    if (QVar16.jd + 0xb69eeff91fU < 0x16d3e147974) {
      iVar6 = QCalendar::dayOfWeek(local_150,QVar16);
      if ((local_164 == Acceptable) && (iVar23 != iVar6)) {
LAB_003bf76e:
        if (((ulong)local_158 & 0x3000) != 0) {
          bVar4 = true;
          if (((uint)local_158._0_4_ >> 8 & 1) == 0) {
            bVar4 = bVar21;
          }
          bVar21 = bVar4;
          if ((((SVar8 & DayOfWeekSectionMask) != NoSection) || (this->currentSectionIndex == -1))
             || (((SVar8 & (YearSectionMask|MonthSection)) != NoSection && (!bVar4)))) {
            day = weekDayWithinMonth(local_150->d_ptr,year,month,day,dayofweek);
          }
        }
      }
    }
    else if (local_164 == Acceptable) goto LAB_003bf76e;
    if ((SVar8 & DaySectionMask) == NoSection) {
      if ((day < this->cachedDay) &&
         ((((ulong)local_158 & 0x3000) == 0 || (local_164 != Acceptable)))) {
        bVar4 = true;
        day = this->cachedDay;
      }
      else {
        bVar4 = false;
      }
    }
    else {
      this->cachedDay = day;
      bVar4 = false;
    }
    bVar5 = QCalendar::isDateValid(local_150,year,month,day);
    iVar23 = day;
    if (bVar5) {
LAB_003bf884:
      if (bVar4) {
LAB_003bf88c:
        if (this->context == FromString) goto LAB_003bf525;
        if (local_164 == Acceptable) {
          if (this->fixday == true) {
            iVar23 = QCalendar::daysInMonth(local_150,month,year);
            if (day < iVar23) {
              iVar23 = day;
            }
            namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
            day = iVar23;
            (*this->_vptr_QDateTimeParser[6])(&namedZone,this);
            for (iVar23 = 0; (int)local_108 != iVar23; iVar23 = iVar23 + 1) {
              pSVar18 = sectionNode(this,iVar23);
              this_00 = local_150;
              uVar27._0_4_ = pSVar18->type;
              uVar27._4_4_ = pSVar18->pos;
              if (((uint)(undefined4)uVar27 >> 8 & 1) == 0) {
                if ((uVar27 & 0x3000) != 0) {
                  QDate::QDate(&local_c8,year,month,day,local_150->d_ptr);
                  iVar6 = QCalendar::dayOfWeek(this_00,local_c8);
                  date.jd._0_4_ = -0x55555556;
                  date.jd._4_4_ = 0xaaaaaaaa;
                  QLocale::dayName((QString *)&date,(QLocale *)&namedZone,iVar6,
                                   (uint)((undefined4)uVar27 == 0x1000));
                  sn.count = (int)extraout_RDX_00;
                  sn.zeroesAdded = (int)((ulong)extraout_RDX_00 >> 0x20);
                  sn.type = (undefined4)uVar27;
                  sn.pos = uVar27._4_4_;
                  iVar6 = sectionPos(this,sn);
                  iVar9 = sectionSize(this,iVar23);
                  QString::replace(local_f8,(long)iVar6,(long)iVar9,(QString *)&date);
                  goto LAB_003bfa20;
                }
              }
              else {
                sn_00.count = (int)extraout_RDX;
                sn_00.zeroesAdded = (int)((ulong)extraout_RDX >> 0x20);
                sn_00.type = (undefined4)uVar27;
                sn_00.pos = uVar27._4_4_;
                iVar6 = sectionPos(this,sn_00);
                iVar9 = sectionSize(this,iVar23);
                QLocale::toString((QString *)&date,(QLocale *)&namedZone,day);
                QString::replace(local_f8,(long)iVar6,(long)iVar9,(QString *)&date);
LAB_003bfa20:
                QArrayDataPointer<char16_t>::~QArrayDataPointer
                          ((QArrayDataPointer<char16_t> *)&date);
              }
            }
            QLocale::~QLocale((QLocale *)&namedZone);
            local_164 = Acceptable;
          }
          else {
LAB_003bfa39:
            local_164 = Intermediate;
          }
        }
        else if (1 < (int)local_164) goto LAB_003bfa39;
      }
    }
    else {
      iVar9 = QCalendar::maximumDaysInMonth(local_150);
      iVar6 = day;
      if (iVar23 <= iVar9) {
        this->cachedDay = day;
      }
      iVar23 = QCalendar::minimumDaysInMonth(local_150);
      if (iVar6 <= iVar23) goto LAB_003bf884;
      bVar5 = QCalendar::isDateValid(local_150,year,month,1);
      if (bVar5 || bVar4) goto LAB_003bf88c;
    }
    iVar23 = hour;
    bVar4 = bVar21;
    if (this->parserType != QDate) goto LAB_003bfa5f;
  }
  hour = iVar23;
  date.jd._0_4_ = -0x55555556;
  date.jd._4_4_ = 0xaaaaaaaa;
  QDate::QDate(&date,year,month,day,local_150->d_ptr);
  iVar9 = minute;
  iVar6 = second;
  iVar23 = msec;
  time.mds = -0x55555556;
  QTime::QTime(&time,hour,minute,second,msec);
  when.d._0_4_ = 0xaaaaaaaa;
  when.d._4_4_ = 0xaaaaaaaa;
  date_01.jd._4_4_ = date.jd._4_4_;
  date_01.jd._0_4_ = date.jd._0_4_;
  QDateTime::QDateTime(&when,date_01,time,&timeZone,LegacyBehavior);
  tVar11 = QDateTime::time(&when,(time_t *)date_01.jd);
  if (((int)tVar11 == time.mds) &&
     (QVar16 = QDateTime::date(&when), QVar16.jd == CONCAT44(date.jd._4_4_,date.jd._0_4_))) {
LAB_003bfbc3:
    StateNode::StateNode(local_140,&when,local_164,local_148,bVar4);
  }
  else {
    if (((ulong)local_158 & 0x30) != 0) {
      if (0 < (int)local_164) {
        local_164 = Intermediate;
      }
      goto LAB_003bfbc3;
    }
    if (this->parserType == QDate) {
      usedDateTime.d = (Data)(ShortData)0x2;
      QDate::startOfDay((QDate *)&namedZone,(QTimeZone *)&date);
LAB_003bfc99:
      StateNode::StateNode(local_140,(QDateTime *)&namedZone,local_164,local_148,bVar4);
      QDateTime::~QDateTime((QDateTime *)&namedZone);
      QTimeZone::~QTimeZone((QTimeZone *)&usedDateTime);
    }
    else {
      if (this->parserType == QTime) {
        date_00.jd._4_4_ = date.jd._4_4_;
        date_00.jd._0_4_ = date.jd._0_4_;
        usedDateTime.d = (Data)(ShortData)0x2;
        QDateTime::QDateTime
                  ((QDateTime *)&namedZone,date_00,time,(QTimeZone *)&usedDateTime,LegacyBehavior);
        goto LAB_003bfc99;
      }
      __timer = (time_t *)QDateTime::toMSecsSinceEpoch(&when);
      namedZone.d = (Data)&DAT_aaaaaaaaaaaaaaaa;
      QDateTime::fromMSecsSinceEpoch((QDateTime *)&namedZone,(qint64)__timer,&timeZone);
      pQVar26 = local_158;
      tVar11 = QDateTime::time((QDateTime *)&namedZone,__timer);
      usedDateTime.d._0_4_ = (int)tVar11;
      QVar16 = QDateTime::date((QDateTime *)&namedZone);
      if ((((QVar16.jd != CONCAT44(date.jd._4_4_,date.jd._0_4_)) ||
           ((((ulong)pQVar26 & 8) != 0 &&
            (iVar10 = QTime::minute((QTime *)&usedDateTime), iVar10 != iVar9)))) ||
          ((((ulong)pQVar26 & 4) != 0 &&
           (iVar9 = QTime::second((QTime *)&usedDateTime), iVar9 != iVar6)))) ||
         ((((ulong)pQVar26 & 2) != 0 &&
          (iVar6 = QTime::msec((QTime *)&usedDateTime), iVar6 != iVar23)))) {
        QDateTime::~QDateTime((QDateTime *)&namedZone);
        goto LAB_003bfbc3;
      }
      StateNode::StateNode(local_140,(QDateTime *)&namedZone,local_164,local_148,bVar4);
      QDateTime::~QDateTime((QDateTime *)&namedZone);
    }
  }
  pQVar26 = &when;
LAB_003bf675:
  QDateTime::~QDateTime(pQVar26);
LAB_003bf67a:
  QTimeZone::~QTimeZone(&timeZone);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return local_140;
}

Assistant:

QDateTimeParser::StateNode
QDateTimeParser::scanString(const QDateTime &defaultValue, bool fixup) const
{
    State state = Acceptable;
    bool conflicts = false;
    const int sectionNodesCount = sectionNodes.size();
    int padding = 0;
    int pos = 0;
    int year, month, day;
    const QDate defaultDate = defaultValue.date();
    const QTime defaultTime = defaultValue.time();
    defaultDate.getDate(&year, &month, &day);
    int year2digits = year % 100;
    int hour = defaultTime.hour();
    int hour12 = -1;
    int minute = defaultTime.minute();
    int second = defaultTime.second();
    int msec = defaultTime.msec();
    int dayofweek = calendar.dayOfWeek(defaultDate);
    QTimeZone timeZone = defaultValue.timeRepresentation();

    int ampm = -1;
    Sections isSet = NoSection;

    for (int index = 0; index < sectionNodesCount; ++index) {
        Q_ASSERT(state != Invalid);
        const QString &separator = separators.at(index);
        int step = matchesSeparator(QStringView{m_text}.sliced(pos), separator);
        if (step == -1) {
            QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                      << "does not start with" << separator
                      << index << pos << currentSectionIndex;
            return StateNode();
        }
        pos += step;
        sectionNodes[index].pos = pos;
        int *current = nullptr;
        int zoneOffset; // Needed to serve as *current when setting zone
        const SectionNode sn = sectionNodes.at(index);
        const QDateTime usedDateTime = [&] {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            const QTime time = actualTime(isSet, hour, hour12, ampm, minute, second, msec);
            return QDateTime(date, time, timeZone);
        }();
        ParsedSection sect = parseSection(usedDateTime, index, pos);

        QDTPDEBUG << "sectionValue" << sn.name() << m_text
                  << "pos" << pos << "used" << sect.used << stateName(sect.state);

        padding += sect.zeroes;
        if (fixup && sect.state == Intermediate && sect.used < sn.count) {
            const FieldInfo fi = fieldInfo(index);
            if ((fi & (Numeric|FixedWidth)) == (Numeric|FixedWidth)) {
                const QString newText = QString::asprintf("%0*d", sn.count, sect.value);
                m_text.replace(pos, sect.used, newText);
                sect.used = sn.count;
            }
        }

        state = qMin<State>(state, sect.state);
        // QDateTimeEdit can fix Intermediate and zeroes, but input needing that didn't match format:
        if (state == Invalid || (context == FromString && (state == Intermediate || sect.zeroes)))
            return StateNode();

        switch (sn.type) {
        case TimeZoneSection:
            current = &zoneOffset;
            if (sect.used > 0) {
                // Synchronize with what findTimeZone() found:
                QStringView zoneName = QStringView{m_text}.sliced(pos, sect.used);
                Q_ASSERT(!zoneName.isEmpty()); // sect.used > 0

                const QStringView offsetStr
                    = zoneName.startsWith("UTC"_L1) ? zoneName.sliced(3) : zoneName;
                const bool isUtcOffset = offsetStr.startsWith(u'+') || offsetStr.startsWith(u'-');
                const bool isUtc = zoneName == "Z"_L1 || zoneName == "UTC"_L1;

                if (isUtc || isUtcOffset) {
                    timeZone = QTimeZone::fromSecondsAheadOfUtc(sect.value);
#if QT_CONFIG(timezone)
                } else if (startsWithLocalTimeZone(zoneName, usedDateTime, locale()) != sect.used) {
                    QTimeZone namedZone = QTimeZone(zoneName.toLatin1());
                    Q_ASSERT(namedZone.isValid());
                    timeZone = namedZone;
#endif
                } else {
                    timeZone = QTimeZone::LocalTime;
                }
            }
            break;
        case Hour24Section: current = &hour; break;
        case Hour12Section: current = &hour12; break;
        case MinuteSection: current = &minute; break;
        case SecondSection: current = &second; break;
        case MSecSection: current = &msec; break;
        case YearSection: current = &year; break;
        case YearSection2Digits: current = &year2digits; break;
        case MonthSection: current = &month; break;
        case DayOfWeekSectionShort:
        case DayOfWeekSectionLong: current = &dayofweek; break;
        case DaySection: current = &day; sect.value = qMax<int>(1, sect.value); break;
        case AmPmSection: current = &ampm; break;
        default:
            qWarning("QDateTimeParser::parse Internal error (%ls)",
                     qUtf16Printable(sn.name()));
            return StateNode();
        }
        Q_ASSERT(current);
        Q_ASSERT(sect.state != Invalid);

        if (sect.used > 0)
            pos += sect.used;
        QDTPDEBUG << index << sn.name() << "is set to"
                  << pos << "state is" << stateName(state);

        if (isSet & sn.type && *current != sect.value) {
            QDTPDEBUG << "CONFLICT " << sn.name() << *current << sect.value;
            conflicts = true;
            if (index != currentSectionIndex)
                continue;
        }
        *current = sect.value;

        // Record the present section:
        isSet |= sn.type;
    }

    int step = matchesSeparator(QStringView{m_text}.sliced(pos), separators.last());
    if (step == -1 || step + pos < m_text.size()) {
        QDTPDEBUG << "invalid because" << QStringView{m_text}.sliced(pos)
                  << "does not match" << separators.last() << pos;
        return StateNode();
    }

    if (parserType != QMetaType::QTime) {
        if (year % 100 != year2digits && (isSet & YearSection2Digits)) {
            const QDate date = actualDate(isSet, calendar, defaultCenturyStart,
                                          year, year2digits, month, day, dayofweek);
            if (!date.isValid()) {
                state = Invalid;
            } else if (!(isSet & YearSection)) {
                year = date.year();
            } else {
                conflicts = true;
                const SectionNode &sn = sectionNode(currentSectionIndex);
                if (sn.type == YearSection2Digits)
                    year = date.year();
            }
        }

        const auto fieldType = sectionType(currentSectionIndex);
        const QDate date(year, month, day, calendar);
        if ((!date.isValid() || dayofweek != calendar.dayOfWeek(date))
                && state == Acceptable && isSet & DayOfWeekSectionMask) {
            if (isSet & DaySection)
                conflicts = true;
            // Change to day of week should adjust day of month;
            // when day of month isn't set, so should change to year or month.
            if (currentSectionIndex == -1 || fieldType & DayOfWeekSectionMask
                    || (!conflicts && (fieldType & (YearSectionMask | MonthSection)))) {
                day = weekDayWithinMonth(calendar, year, month, day, dayofweek);
                QDTPDEBUG << year << month << day << dayofweek
                          << calendar.dayOfWeek(QDate(year, month, day, calendar));
            }
        }

        bool needfixday = false;
        if (fieldType & DaySectionMask) {
            cachedDay = day;
        } else if (cachedDay > day && !(isSet & DayOfWeekSectionMask && state == Acceptable)) {
            day = cachedDay;
            needfixday = true;
        }

        if (!calendar.isDateValid(year, month, day)) {
            if (day <= calendar.maximumDaysInMonth())
                cachedDay = day;
            if (day > calendar.minimumDaysInMonth() && calendar.isDateValid(year, month, 1))
                needfixday = true;
        }
        if (needfixday) {
            if (context == FromString)
                return StateNode();
            if (state == Acceptable && fixday) {
                day = qMin<int>(day, calendar.daysInMonth(month, year));

                const QLocale loc = locale();
                for (int i=0; i<sectionNodesCount; ++i) {
                    const SectionNode sn = sectionNode(i);
                    if (sn.type & DaySection) {
                        m_text.replace(sectionPos(sn), sectionSize(i), loc.toString(day));
                    } else if (sn.type & DayOfWeekSectionMask) {
                        const int dayOfWeek = calendar.dayOfWeek(QDate(year, month, day, calendar));
                        const QLocale::FormatType dayFormat =
                            (sn.type == DayOfWeekSectionShort
                             ? QLocale::ShortFormat : QLocale::LongFormat);
                        const QString dayName(loc.dayName(dayOfWeek, dayFormat));
                        m_text.replace(sectionPos(sn), sectionSize(i), dayName);
                    }
                }
            } else if (state > Intermediate) {
                state = Intermediate;
            }
        }
    }

    if (parserType != QMetaType::QDate) {
        if (isSet & Hour12Section) {
            const bool hasHour = isSet.testAnyFlag(Hour24Section);
            if (ampm == -1) // If we don't know from hour, assume am:
                ampm = !hasHour || hour < 12 ? 0 : 1;
            hour12 = hour12 % 12 + ampm * 12;
            if (!hasHour)
                hour = hour12;
            else if (hour != hour12)
                conflicts = true;
        } else if (ampm != -1) {
            if (!(isSet & (Hour24Section)))
                hour = 12 * ampm; // Special case: only ap section
            else if ((ampm == 0) != (hour < 12))
                conflicts = true;
        }
    }

    QDTPDEBUG << year << month << day << hour << minute << second << msec;
    Q_ASSERT(state != Invalid);

    const QDate date(year, month, day, calendar);
    const QTime time(hour, minute, second, msec);
    const QDateTime when = QDateTime(date, time, timeZone);

    if (when.time() != time || when.date() != date) {
        // In a spring-forward, if we hit the skipped hour, we may have been
        // shunted out of it.

        // If hour wasn't specified, so we're using our default, changing it may
        // fix that.
        if (!(isSet & HourSectionMask)) {
            switch (parserType) {
            case QMetaType::QDateTime: {
                qint64 msecs = when.toMSecsSinceEpoch();
                // Fortunately, that gets a useful answer, even though when is invalid ...
                const QDateTime replace = QDateTime::fromMSecsSinceEpoch(msecs, timeZone);
                const QTime tick = replace.time();
                if (replace.date() == date
                    && (!(isSet & MinuteSection) || tick.minute() == minute)
                    && (!(isSet & SecondSection) || tick.second() == second)
                    && (!(isSet & MSecSection)   || tick.msec() == msec)) {
                    return StateNode(replace, state, padding, conflicts);
                }
            } break;
            case QMetaType::QDate:
                // Don't care about time, so just use start of day (and ignore spec):
                return StateNode(date.startOfDay(QTimeZone::UTC),
                                 state, padding, conflicts);
                break;
            case QMetaType::QTime:
                // Don't care about date or representation, so pick a safe representation:
                return StateNode(QDateTime(date, time, QTimeZone::UTC),
                                 state, padding, conflicts);
            default:
                Q_UNREACHABLE_RETURN(StateNode());
            }
        } else if (state > Intermediate) {
            state = Intermediate;
        }
    }

    return StateNode(when, state, padding, conflicts);
}